

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

uint16_t __thiscall Samba::checksumBuffer(Samba *this,uint32_t start_addr,uint32_t size)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  SambaError *pSVar4;
  pointer pSVar5;
  int *piVar6;
  ulong uVar7;
  uint32_t res;
  int l;
  uint8_t cmd [64];
  uint32_t size_local;
  uint32_t start_addr_local;
  Samba *this_local;
  
  if ((this->_canChecksumBuffer & 1U) == 0) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  uVar1 = checksumBufferSize(this);
  if (uVar1 < size) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_debug & 1U) != 0) {
    printf("%s(start_addr=%#x, size=%#x) = ","checksumBuffer",(ulong)start_addr,(ulong)size);
  }
  uVar2 = snprintf((char *)&res,0x40,"Z%08X,%08X#",(ulong)start_addr,(ulong)size);
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  uVar3 = (*pSVar5->_vptr_SerialPort[6])(pSVar5,&res,(ulong)uVar2);
  if (uVar3 != uVar2) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[9])(pSVar5,5000);
  res._0_1_ = '\0';
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[5])(pSVar5,&res,0xc);
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[9])(pSVar5,1000);
  if ((char)res != 'Z') {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  cmd[1] = '\0';
  piVar6 = __errno_location();
  *piVar6 = 0;
  uVar7 = strtol((char *)((long)&res + 1),(char **)0x0,0x10);
  piVar6 = __errno_location();
  if (*piVar6 != 0) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_debug & 1U) != 0) {
    printf("%x\n",uVar7 & 0xffffffff);
  }
  return (uint16_t)uVar7;
}

Assistant:

uint16_t
Samba::checksumBuffer(uint32_t start_addr, uint32_t size)
{
    if (!_canChecksumBuffer)
        throw SambaError();

    if (size > checksumBufferSize())
        throw SambaError();
        
    if (_debug)
        printf("%s(start_addr=%#x, size=%#x) = ", __FUNCTION__, start_addr, size);

    uint8_t cmd[64];
    int l = snprintf((char*) cmd, sizeof(cmd), "Z%08X,%08X#", start_addr, size);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_LONG);
    cmd[0] = 0;
    _port->read(cmd, 12); // Expects "Z00000000#\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'Z')
        throw SambaError();

    cmd[9] = 0;
    errno = 0;
    uint32_t res = strtol((char*) &cmd[1], NULL, 16);
    if (errno != 0)
        throw SambaError();
    if (_debug)
        printf("%x\n", res);
    return res;
}